

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::Recycle
          (VulkanSyncObjectManager *this,VkSemaphoreType vkSem,bool IsUnsignaled)

{
  undefined7 in_register_00000011;
  Type local_18;
  
  local_18 = vkSem.Value;
  if ((int)CONCAT71(in_register_00000011,IsUnsignaled) != 0) {
    std::mutex::lock(&this->m_SemaphorePoolGuard);
    std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
              (&this->m_SemaphorePool,&local_18);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
    return;
  }
  (*vkDestroySemaphore)(this->m_LogicalDevice->m_VkDevice,vkSem.Value,(VkAllocationCallbacks *)0x0);
  return;
}

Assistant:

void VulkanSyncObjectManager::Recycle(VkSemaphoreType vkSem, bool IsUnsignaled)
{
    // Can not reuse semaphore in signaled state
    if (!IsUnsignaled)
    {
        vkDestroySemaphore(m_LogicalDevice.GetVkDevice(), vkSem.Value, nullptr);
        return;
    }

    std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};
    m_SemaphorePool.push_back(vkSem.Value);
}